

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
* __thiscall wallet::CWallet::GetActiveScriptPubKeyMans(CWallet *this)

{
  long lVar1;
  const_iterator pbVar2;
  const_iterator pvVar3;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>,_bool> pVar4;
  const_iterator __end2;
  const_iterator __begin2;
  array<OutputType,_4UL> *__range2;
  bool internal;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> *__range1;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *spk_mans;
  ScriptPubKeyMan *spk_man;
  OutputType t;
  initializer_list<bool> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  _Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> in_stack_ffffffffffffff38;
  ScriptPubKeyMan *in_stack_ffffffffffffff40;
  CWallet *this_00;
  const_iterator local_88;
  const_iterator local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
         *)in_stack_ffffffffffffff28);
  local_68 = std::initializer_list<bool>::begin(in_stack_ffffffffffffff28);
  pbVar2 = std::initializer_list<bool>::end
                     ((initializer_list<bool> *)in_stack_ffffffffffffff38._M_node);
  for (; local_68 != pbVar2; local_68 = local_68 + 1) {
    local_88 = std::array<OutputType,_4UL>::begin
                         ((array<OutputType,_4UL> *)in_stack_ffffffffffffff28);
    pvVar3 = std::array<OutputType,_4UL>::end((array<OutputType,_4UL> *)in_stack_ffffffffffffff28);
    for (; local_88 != pvVar3; local_88 = local_88 + 1) {
      in_stack_ffffffffffffff40 =
           GetScriptPubKeyMan(this_00,(OutputType *)in_RDI,
                              SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
      if (in_stack_ffffffffffffff40 != (ScriptPubKeyMan *)0x0) {
        pVar4 = std::
                set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                ::insert((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                          *)in_stack_ffffffffffffff38._M_node,
                         (value_type *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
                        );
        in_stack_ffffffffffffff38 = pVar4.first._M_node;
        in_stack_ffffffffffffff37 = pVar4.second;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          *)this_00;
}

Assistant:

std::set<ScriptPubKeyMan*> CWallet::GetActiveScriptPubKeyMans() const
{
    std::set<ScriptPubKeyMan*> spk_mans;
    for (bool internal : {false, true}) {
        for (OutputType t : OUTPUT_TYPES) {
            auto spk_man = GetScriptPubKeyMan(t, internal);
            if (spk_man) {
                spk_mans.insert(spk_man);
            }
        }
    }
    return spk_mans;
}